

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O3

void __thiscall node::anon_unknown_2::NodeImpl::startShutdown(NodeImpl *this)

{
  string_view source_file;
  bool bVar1;
  NodeContext **ppNVar2;
  SignalInterrupt **ppSVar3;
  Logger *pLVar4;
  ArgsManager *this_00;
  long in_FS_OFFSET;
  string_view str;
  string_view logging_function;
  string log_msg;
  string local_78;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  ppNVar2 = inline_assertion_check<true,node::NodeContext*&>
                      (&this->m_context,
                       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/interfaces.cpp"
                       ,0x85,"startShutdown","m_context");
  ppSVar3 = inline_assertion_check<true,util::SignalInterrupt*&>
                      (&(*ppNVar2)->shutdown,
                       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/interfaces.cpp"
                       ,0x85,"startShutdown","Assert(m_context)->shutdown");
  bVar1 = util::SignalInterrupt::operator()(*ppSVar3);
  if (!bVar1) {
    pLVar4 = LogInstance();
    bVar1 = BCLog::Logger::Enabled(pLVar4);
    if (bVar1) {
      local_58._M_string_length = 0;
      local_58.field_2._M_local_buf[0] = '\0';
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      tinyformat::format<>(&local_78,"Failed to send shutdown signal\n");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&local_58,&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      pLVar4 = LogInstance();
      local_78._M_dataplus._M_p = (pointer)0x5c;
      local_78._M_string_length = 0x81b7eb;
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/interfaces.cpp"
      ;
      source_file._M_len = 0x5c;
      str._M_str = local_58._M_dataplus._M_p;
      str._M_len = local_58._M_string_length;
      logging_function._M_str = "startShutdown";
      logging_function._M_len = 0xd;
      BCLog::Logger::LogPrintStr(pLVar4,str,logging_function,source_file,0x86,ALL,Error);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,
                        CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                 local_58.field_2._M_local_buf[0]) + 1);
      }
    }
  }
  this_00 = args(this);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"-server","");
  bVar1 = ArgsManager::GetBoolArg(this_00,&local_58,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                             local_58.field_2._M_local_buf[0]) + 1);
  }
  if (bVar1) {
    InterruptRPC();
    StopRPC();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void startShutdown() override
    {
        if (!(*Assert(Assert(m_context)->shutdown))()) {
            LogError("Failed to send shutdown signal\n");
        }
        // Stop RPC for clean shutdown if any of waitfor* commands is executed.
        if (args().GetBoolArg("-server", false)) {
            InterruptRPC();
            StopRPC();
        }
    }